

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture.cpp
# Opt level: O1

void __thiscall iu_TestFixed2_x_iutest_x_Test2_Test::Body(iu_TestFixed2_x_iutest_x_Test2_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1f9;
  AssertionResult local_1f8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  local_1a0._0_4_ = 2;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f8,(internal *)0x20275a,"x",local_1a0,&TestFixed::x,in_R9);
  bVar2 = local_1f8.m_result;
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/fixture.cpp";
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x43;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  paVar1 = &local_1f8.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    local_1a0._0_4_ = 2;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_1f8,(internal *)0x20275a,"x",local_1a0,&TestFixed::x,in_R9);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/fixture.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x44;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a0._0_4_ = 2;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_1f8,(internal *)0x20275a,"x",local_1a0,&TestFixed::x,in_R9);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/fixture.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x45;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST_F(TestFixed2, Test2)
{
    IUTEST_ASSERT_EQ(2, x);
    IUTEST_EXPECT_EQ(2, x);
    IUTEST_INFORM_EQ(2, x);
}